

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setViewport(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              *this,GLint viewportX,GLint viewportY,GLsizei viewportWidth,GLsizei viewportHeight)

{
  if ((((this->ViewportX != viewportX) || (this->ViewportY != viewportY)) ||
      (this->ViewportWidth != viewportWidth)) || (this->ViewportHeight != viewportHeight)) {
    (*GL.Viewport)(viewportX,viewportY,viewportWidth,viewportHeight);
    this->ViewportX = viewportX;
    this->ViewportY = viewportY;
    this->ViewportWidth = viewportWidth;
    this->ViewportHeight = viewportHeight;
  }
  return;
}

Assistant:

void setViewport(GLint viewportX, GLint viewportY, GLsizei viewportWidth, GLsizei viewportHeight)
	{
		if (ViewportX != viewportX || ViewportY != viewportY || ViewportWidth != viewportWidth || ViewportHeight != viewportHeight) {
			GL.Viewport(viewportX, viewportY, viewportWidth, viewportHeight);
			ViewportX = viewportX;
			ViewportY = viewportY;
			ViewportWidth = viewportWidth;
			ViewportHeight = viewportHeight;
		}
	}